

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio.c
# Opt level: O0

int puts(char *__s)

{
  int iVar1;
  FILE *pFVar2;
  size_t count;
  int r;
  char *str_local;
  
  pFVar2 = __stdout();
  count = strlen(__s);
  iVar1 = _Write(pFVar2,__s,count);
  if (iVar1 < 0) {
    str_local._4_4_ = -1;
  }
  else {
    pFVar2 = __stdout();
    str_local._4_4_ = _Write(pFVar2,"\n",1);
    if (str_local._4_4_ < 0) {
      str_local._4_4_ = -1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int puts(const char *str) {
    int r = _Write(stdout, str, strlen(str));
    if (r < 0) {
        return EOF;
    }

    r = _Write(stdout, "\n", 1);
    if (r < 0) {
        return EOF;
    }

    return r;
}